

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

void aom_img_write(aom_image_t *img,FILE *file)

{
  int iVar1;
  aom_img_fmt_t aVar2;
  aom_img_fmt_t aVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uchar *__ptr;
  bool bVar7;
  
  aVar3 = img->fmt;
  lVar6 = 0;
  do {
    __ptr = img->planes[lVar6];
    iVar1 = img->stride[lVar6];
    iVar4 = aom_img_plane_width(img,(int)lVar6);
    iVar5 = aom_img_plane_height(img,(int)lVar6);
    aVar2 = img->fmt;
    bVar7 = lVar6 == 2;
    if (bVar7 && aVar2 == AOM_IMG_FMT_NV12) {
      return;
    }
    if (0 < iVar5) {
      do {
        fwrite(__ptr,2 - (ulong)((aVar3 & 0x800) == AOM_IMG_FMT_NONE),
               (long)(iVar4 << (lVar6 == 1 && aVar2 == AOM_IMG_FMT_NV12)),(FILE *)file);
        __ptr = __ptr + iVar1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    lVar6 = lVar6 + 1;
  } while ((!bVar7 || aVar2 != AOM_IMG_FMT_NV12) && lVar6 != 3);
  return;
}

Assistant:

void aom_img_write(const aom_image_t *img, FILE *file) {
  int plane;
  const int bytespp = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;

  for (plane = 0; plane < 3; ++plane) {
    const unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    int y;

    // Assuming that for nv12 we write all chroma data at once
    if (img->fmt == AOM_IMG_FMT_NV12 && plane > 1) break;
    if (img->fmt == AOM_IMG_FMT_NV12 && plane == 1) w *= 2;

    for (y = 0; y < h; ++y) {
      fwrite(buf, bytespp, w, file);
      buf += stride;
    }
  }
}